

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

int buildAllRequests(HTTPAPIEX_HANDLE_DATA *handle,HTTPAPI_REQUEST_TYPE requestType,
                    char *relativePath,HTTP_HEADERS_HANDLE requestHttpHeadersHandle,
                    BUFFER_HANDLE requestContent,uint *statusCode,
                    HTTP_HEADERS_HANDLE responseHttpHeadersHandle,BUFFER_HANDLE responseContent,
                    char **toBeUsedRelativePath,
                    HTTP_HEADERS_HANDLE *toBeUsedRequestHttpHeadersHandle,
                    _Bool *isOriginalRequestHttpHeadersHandle,BUFFER_HANDLE *toBeUsedRequestContent,
                    _Bool *isOriginalRequestContent,uint **toBeUsedStatusCode,
                    HTTP_HEADERS_HANDLE *toBeUsedResponseHttpHeadersHandle,
                    _Bool *isOriginalResponseHttpHeadersHandle,
                    BUFFER_HANDLE *toBeUsedResponseContent,_Bool *isOriginalResponseContent)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  uint *statusCode_local;
  BUFFER_HANDLE requestContent_local;
  HTTP_HEADERS_HANDLE requestHttpHeadersHandle_local;
  char *relativePath_local;
  HTTPAPI_REQUEST_TYPE requestType_local;
  HTTPAPIEX_HANDLE_DATA *handle_local;
  
  iVar1 = buildBufferIfNotExist(requestContent,isOriginalRequestContent,toBeUsedRequestContent);
  if (iVar1 == 0) {
    iVar1 = buildRequestHttpHeadersHandle
                      (handle,*toBeUsedRequestContent,requestHttpHeadersHandle,
                       isOriginalRequestHttpHeadersHandle,toBeUsedRequestHttpHeadersHandle);
    if (iVar1 == 0) {
      if (relativePath == (char *)0x0) {
        *toBeUsedRelativePath = "";
      }
      else {
        *toBeUsedRelativePath = relativePath;
      }
      if (statusCode == (uint *)0x0) {
        *toBeUsedStatusCode = &dummyStatusCode;
      }
      else {
        *toBeUsedStatusCode = statusCode;
      }
      iVar1 = buildResponseHttpHeadersHandle
                        (responseHttpHeadersHandle,isOriginalResponseHttpHeadersHandle,
                         toBeUsedResponseHttpHeadersHandle);
      if (iVar1 == 0) {
        iVar1 = buildBufferIfNotExist
                          (responseContent,isOriginalResponseContent,toBeUsedResponseContent);
        if (iVar1 == 0) {
          l._4_4_ = 0;
        }
        else {
          if ((*isOriginalRequestContent & 1U) == 0) {
            BUFFER_delete(*toBeUsedRequestContent);
            *toBeUsedRequestContent = (BUFFER_HANDLE)0x0;
          }
          if ((*isOriginalRequestHttpHeadersHandle & 1U) == 0) {
            HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
            *toBeUsedRequestHttpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
          }
          if ((*isOriginalResponseHttpHeadersHandle & 1U) == 0) {
            HTTPHeaders_Free(*toBeUsedResponseHttpHeadersHandle);
            *toBeUsedResponseHttpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
          }
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                      ,"buildAllRequests",0x14a,1,"unable to build response content");
          }
          l._4_4_ = 0x14b;
        }
      }
      else {
        if ((*isOriginalRequestContent & 1U) == 0) {
          BUFFER_delete(*toBeUsedRequestContent);
        }
        if ((*isOriginalRequestHttpHeadersHandle & 1U) == 0) {
          HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
          *toBeUsedRequestHttpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                    ,"buildAllRequests",0x131,1,"unable to build response content");
        }
        l._4_4_ = 0x132;
      }
    }
    else {
      if ((*isOriginalRequestContent & 1U) == 0) {
        BUFFER_delete(*toBeUsedRequestContent);
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                  ,"buildAllRequests",0x109,1,"unable to build the request http headers handle");
      }
      l._4_4_ = 0x10a;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                ,"buildAllRequests",0xfd,1,"unable to build the request content");
    }
    l._4_4_ = 0xfe;
  }
  return l._4_4_;
}

Assistant:

static int buildAllRequests(HTTPAPIEX_HANDLE_DATA* handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
    HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode,
    HTTP_HEADERS_HANDLE responseHttpHeadersHandle, BUFFER_HANDLE responseContent,

    const char** toBeUsedRelativePath,
    HTTP_HEADERS_HANDLE *toBeUsedRequestHttpHeadersHandle, bool *isOriginalRequestHttpHeadersHandle,
    BUFFER_HANDLE *toBeUsedRequestContent, bool *isOriginalRequestContent,
    unsigned int** toBeUsedStatusCode,
    HTTP_HEADERS_HANDLE *toBeUsedResponseHttpHeadersHandle, bool *isOriginalResponseHttpHeadersHandle,
    BUFFER_HANDLE *toBeUsedResponseContent, bool *isOriginalResponseContent)
{
    int result;
    (void)requestType;
    /*Codes_SRS_HTTPAPIEX_02_013: [If requestContent is NULL then HTTPAPIEX_ExecuteRequest shall behave as if a buffer of zero size would have been used, that is, it shall call HTTPAPI_ExecuteRequest with parameter content = NULL and contentLength = 0.]*/
    /*Codes_SRS_HTTPAPIEX_02_014: [If requestContent is not NULL then its content and its size shall be used for parameters content and contentLength of HTTPAPI_ExecuteRequest.] */
    if (buildBufferIfNotExist(requestContent, isOriginalRequestContent, toBeUsedRequestContent) != 0)
    {
        LogError("unable to build the request content");
        result = MU_FAILURE;
    }
    else
    {
        if (buildRequestHttpHeadersHandle(handle, *toBeUsedRequestContent, requestHttpHeadersHandle, isOriginalRequestHttpHeadersHandle, toBeUsedRequestHttpHeadersHandle) != 0)
        {
            /*Codes_SRS_HTTPAPIEX_02_010: [If any of the operations in SRS_HTTAPIEX_02_009 fails, then HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_ERROR.] */
            if (*isOriginalRequestContent == false)
            {
                BUFFER_delete(*toBeUsedRequestContent);
            }
            LogError("unable to build the request http headers handle");
            result = MU_FAILURE;
        }
        else
        {
            /*Codes_SRS_HTTPAPIEX_02_008: [If parameter relativePath is NULL then HTTPAPIEX_INVALID_ARG shall not assume a relative path - that is, it will assume an empty path ("").] */
            if (relativePath == NULL)
            {
                *toBeUsedRelativePath = "";
            }
            else
            {
                *toBeUsedRelativePath = relativePath;
            }

            /*Codes_SRS_HTTPAPIEX_02_015: [If statusCode is NULL then HTTPAPIEX_ExecuteRequest shall not write in statusCode the HTTP status code, and it will use a temporary internal int for parameter statusCode to the calls of HTTPAPI_ExecuteRequest.] */
            if (statusCode == NULL)
            {
                /*Codes_SRS_HTTPAPIEX_02_016: [If statusCode is not NULL then If statusCode is NULL then HTTPAPIEX_ExecuteRequest shall use it for parameter statusCode to the calls of HTTPAPI_ExecuteRequest.] */
                *toBeUsedStatusCode = &dummyStatusCode;
            }
            else
            {
                *toBeUsedStatusCode = statusCode;
            }

            /*Codes_SRS_HTTPAPIEX_02_017: [If responseHeaders handle is NULL then HTTPAPIEX_ExecuteRequest shall create a temporary internal instance of HTTPHEADERS object and use that for responseHeaders parameter of HTTPAPI_ExecuteRequest call.] */
            /*Codes_SRS_HTTPAPIEX_02_019: [If responseHeaders is not NULL, then then HTTPAPIEX_ExecuteRequest shall use that object as parameter responseHeaders of HTTPAPI_ExecuteRequest call.] */
            if (buildResponseHttpHeadersHandle(responseHttpHeadersHandle, isOriginalResponseHttpHeadersHandle, toBeUsedResponseHttpHeadersHandle) != 0)
            {
                /*Codes_SRS_HTTPAPIEX_02_018: [If creating the temporary http headers in SRS_HTTPAPIEX_02_017 fails then HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_ERROR.] */
                if (*isOriginalRequestContent == false)
                {
                    BUFFER_delete(*toBeUsedRequestContent);
                }
                if (*isOriginalRequestHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
                    *toBeUsedRequestHttpHeadersHandle = NULL;
                }
                LogError("unable to build response content");
                result = MU_FAILURE;
            }
            else
            {
                /*Codes_SRS_HTTPAPIEX_02_020: [If responseContent is NULL then HTTPAPIEX_ExecuteRequest shall create a temporary internal BUFFER object and use that as parameter responseContent of HTTPAPI_ExecuteRequest call.] */
                /*Codes_SRS_HTTPAPIEX_02_022: [If responseContent is not NULL then HTTPAPIEX_ExecuteRequest use that as parameter responseContent of HTTPAPI_ExecuteRequest call.] */
                if (buildBufferIfNotExist(responseContent, isOriginalResponseContent, toBeUsedResponseContent) != 0)
                {
                    /*Codes_SRS_HTTPAPIEX_02_021: [If creating the BUFFER_HANDLE in SRS_HTTPAPIEX_02_020 fails, then HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_ERROR.] */
                    if (*isOriginalRequestContent == false)
                    {
                        BUFFER_delete(*toBeUsedRequestContent);
                        *toBeUsedRequestContent = NULL;
                    }
                    if (*isOriginalRequestHttpHeadersHandle == false)
                    {
                        HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
                        *toBeUsedRequestHttpHeadersHandle = NULL;
                    }
                    if (*isOriginalResponseHttpHeadersHandle == false)
                    {
                        HTTPHeaders_Free(*toBeUsedResponseHttpHeadersHandle);
                        *toBeUsedResponseHttpHeadersHandle = NULL;
                    }
                    LogError("unable to build response content");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
    }
    return result;
}